

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recorder.cpp
# Opt level: O0

void __thiscall helics::apps::Recorder::initialize(Recorder *this)

{
  bool bVar1;
  Federate *this_00;
  long in_RDI;
  Recorder *in_stack_00000010;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int> *val;
  iterator __end2;
  iterator __begin2;
  map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  *__range2;
  Federate *in_stack_00000168;
  int in_stack_000002fc;
  Recorder *in_stack_00000300;
  Time in_stack_00000308;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  size_type in_stack_ffffffffffffffc8;
  vector<helics::apps::Recorder::ValueStats,_std::allocator<helics::apps::Recorder::ValueStats>_>
  *in_stack_ffffffffffffffd0;
  _Self local_20;
  _Self local_18;
  
  CLI::std::
  __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x17d2fc);
  Federate::enterInitializingModeIterative(in_stack_00000168);
  generateInterfaces(in_stack_00000010);
  CLI::std::
  map<helics::InterfaceHandle,_int,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_int>_>_>
  ::size((map<helics::InterfaceHandle,_int,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_int>_>_>
          *)0x17d334);
  CLI::std::
  vector<helics::apps::Recorder::ValueStats,_std::allocator<helics::apps::Recorder::ValueStats>_>::
  resize(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  this_00 = (Federate *)(in_RDI + 0x1d8);
  local_18._M_node =
       (_Base_ptr)
       CLI::std::
       map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
       ::begin((map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                *)in_stack_ffffffffffffffa8);
  local_20._M_node =
       (_Base_ptr)
       CLI::std::
       map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
       ::end((map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
              *)in_stack_ffffffffffffffa8);
  while( true ) {
    bVar1 = CLI::std::operator==(&local_18,&local_20);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    in_stack_ffffffffffffffb0 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         CLI::std::
         _Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
         ::operator*((_Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
                      *)0x17d390);
    CLI::std::
    vector<helics::apps::Recorder::ValueStats,_std::allocator<helics::apps::Recorder::ValueStats>_>
    ::operator[]((vector<helics::apps::Recorder::ValueStats,_std::allocator<helics::apps::Recorder::ValueStats>_>
                  *)(in_RDI + 0x268),(long)*(int *)&in_stack_ffffffffffffffb0->field_2);
    std::__cxx11::string::operator=(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    CLI::std::
    _Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
                  *)in_stack_ffffffffffffffb0);
  }
  CLI::std::
  __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x17d3e4);
  Federate::enterInitializingMode(this_00);
  TimeRepresentation<count_time<9,_long>_>::TimeRepresentation
            ((TimeRepresentation<count_time<9,_long>_> *)in_stack_ffffffffffffffb0,
             (double)in_stack_ffffffffffffffa8);
  captureForCurrentTime(in_stack_00000300,in_stack_00000308,in_stack_000002fc);
  CLI::std::
  __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x17d424);
  Federate::enterExecutingMode((Federate *)__end2._M_node,val._7_1_);
  TimeRepresentation<count_time<9,_long>_>::TimeRepresentation
            ((TimeRepresentation<count_time<9,_long>_> *)in_stack_ffffffffffffffb0,
             (double)in_stack_ffffffffffffffa8);
  captureForCurrentTime(in_stack_00000300,in_stack_00000308,in_stack_000002fc);
  return;
}

Assistant:

void Recorder::initialize()
{
    fed->enterInitializingModeIterative();
    generateInterfaces();

    vStat.resize(subids.size());
    for (auto& val : subkeys) {
        vStat[val.second].key = val.first;
    }

    fed->enterInitializingMode();
    captureForCurrentTime(-1.0);

    fed->enterExecutingMode();
    captureForCurrentTime(0.0);
}